

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

shared_ptr<Image> Image::fromPNG(string *file_name)

{
  uint uVar1;
  Pixel *pPVar2;
  element_type *peVar3;
  runtime_error *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string *in_RSI;
  element_type *in_RDI;
  shared_ptr<Image> sVar4;
  uint *unaff_retaddr;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_00000008;
  uint err;
  shared_ptr<Image> *img;
  uint in_stack_ffffffffffffffe8;
  uint3 in_stack_ffffffffffffffec;
  LodePNGColorType colortype;
  element_type *h;
  
  colortype = (LodePNGColorType)in_stack_ffffffffffffffec;
  h = in_RDI;
  std::make_shared<Image>();
  std::__shared_ptr_access<Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x11a5bf);
  std::__shared_ptr_access<Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x11a5d2);
  std::__shared_ptr_access<Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x11a5e5);
  uVar1 = lodepng::decode(in_stack_00000008,unaff_retaddr,(uint *)h,in_RSI,colortype,
                          in_stack_ffffffffffffffe8);
  std::__shared_ptr_access<Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x11a624);
  pPVar2 = (Pixel *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x11a630);
  peVar3 = std::__shared_ptr_access<Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x11a63f);
  peVar3->pixels = pPVar2;
  if (uVar1 == 0) {
    sVar4.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar4.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
    return (shared_ptr<Image>)sVar4.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Could not load image.");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<Image> Image::fromPNG(const std::string &file_name) {

  auto img = std::make_shared<Image>();

  // Use lodepng to decode a PNG file
  unsigned int err = lodepng::decode(img->raw, img->width, img->height, file_name, LCT_RGBA);

  // Set the pixel pointer to the start of the raw buffer
  img->pixels = reinterpret_cast<Pixel *>(img->raw.data());

  if (err) {
    throw std::runtime_error("Could not load image.");
  }

  return img;
}